

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

SchemaAttDef * __thiscall
xercesc_4_0::TraverseSchema::traverseAnyAttribute(TraverseSchema *this,DOMElement *elem)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  SchemaInfo *pSVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  DOMElement *pDVar11;
  XSAnnotation *pXVar12;
  undefined4 extraout_var;
  short *psVar14;
  undefined4 extraout_var_00;
  XMLCh *pXVar15;
  long lVar16;
  undefined4 extraout_var_01;
  XMLCh *pXVar17;
  SchemaAttDef *this_00;
  ValueVectorOf<unsigned_int> *this_01;
  XMLCh *pXVar18;
  ulong uVar19;
  AttTypes type;
  ValueVectorOf<unsigned_int> namespaceList;
  NamespaceScopeManager nsMgr;
  XMLStringTokenizer tokenizer;
  XSAnnotation *local_b0;
  ValueVectorOf<unsigned_int> local_a8;
  DefAttTypes local_7c;
  DatatypeValidator *local_78;
  NamespaceScopeManager local_70;
  XMLStringTokenizer local_60;
  long *plVar13;
  
  pSVar5 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_70.fScopeAdded = false;
  }
  else {
    local_70.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_70.fSchemaInfo = pSVar5;
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,3,this,false,this->fNonXSAttList);
  pDVar11 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  pDVar11 = checkContent(this,elem,pDVar11,true,true);
  if (pDVar11 != (DOMElement *)0x0) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x54);
  }
  if (((this->fScanner->fGenerateSyntheticAnnotations == true) &&
      (this->fAnnotation == (XSAnnotation *)0x0)) && (this->fNonXSAttList->fCurCount != 0)) {
    pXVar12 = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
    this->fAnnotation = pXVar12;
  }
  pXVar12 = this->fAnnotation;
  iVar8 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,SchemaSymbols::fgATT_PROCESSCONTENTS);
  plVar13 = (long *)CONCAT44(extraout_var,iVar8);
  if (plVar13 == (long *)0x0) {
    psVar14 = (short *)0x0;
  }
  else {
    psVar14 = (short *)(**(code **)(*plVar13 + 0x150))(plVar13);
  }
  iVar8 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,SchemaSymbols::fgATT_NAMESPACE);
  plVar13 = (long *)CONCAT44(extraout_var_00,iVar8);
  if (plVar13 == (long *)0x0) {
    pXVar15 = (XMLCh *)0x0;
  }
  else {
    pXVar15 = (XMLCh *)(**(code **)(*plVar13 + 0x150))(plVar13);
  }
  if (((psVar14 != (short *)0x0) && (psVar14 != &SchemaSymbols::fgATTVAL_STRICT)) && (*psVar14 != 0)
     ) {
    lVar16 = 0;
    do {
      psVar2 = (short *)((long)psVar14 + lVar16);
      if (*psVar2 == 0) {
        if (*(short *)((long)&SchemaSymbols::fgATTVAL_STRICT + lVar16) == 0) goto LAB_00335ba8;
        break;
      }
      psVar1 = (short *)((long)&SchemaSymbols::fgATTVAL_STRICT + lVar16);
      lVar16 = lVar16 + 2;
    } while (*psVar2 == *psVar1);
    local_7c = ProcessContents_Skip;
    if (psVar14 == &SchemaSymbols::fgATTVAL_SKIP) goto LAB_00335bad;
    lVar16 = 0;
    do {
      psVar2 = (short *)((long)psVar14 + lVar16);
      if (*psVar2 == 0) {
        if (*(short *)((long)&SchemaSymbols::fgATTVAL_SKIP + lVar16) == 0) goto LAB_00335bad;
        break;
      }
      psVar1 = (short *)((long)&SchemaSymbols::fgATTVAL_SKIP + lVar16);
      lVar16 = lVar16 + 2;
    } while (*psVar2 == *psVar1);
    if (psVar14 == &SchemaSymbols::fgATTVAL_LAX) {
      local_7c = ProcessContents_Lax;
      goto LAB_00335bad;
    }
    lVar16 = 0;
    do {
      psVar2 = (short *)((long)psVar14 + lVar16);
      if (*psVar2 == 0) {
        local_7c = ProcessContents_Strict -
                   (uint)(*(short *)((long)&SchemaSymbols::fgATTVAL_LAX + lVar16) == 0);
        goto LAB_00335bad;
      }
      psVar1 = (short *)((long)&SchemaSymbols::fgATTVAL_LAX + lVar16);
      lVar16 = lVar16 + 2;
    } while (*psVar2 == *psVar1);
  }
LAB_00335ba8:
  local_7c = ProcessContents_Strict;
LAB_00335bad:
  iVar8 = this->fEmptyNamespaceURI;
  local_a8.fMemoryManager = this->fGrammarPoolMemoryManager;
  local_a8.fCallDestructor = false;
  local_a8.fCurCount = 0;
  local_a8.fMaxCount = 8;
  local_a8.fElemList = (uint *)0x0;
  iVar9 = (*(local_a8.fMemoryManager)->_vptr_MemoryManager[3])();
  local_a8.fElemList = (uint *)CONCAT44(extraout_var_01,iVar9);
  memset(local_a8.fElemList,0,local_a8.fMaxCount << 2);
  type = Any_Any;
  if (((pXVar15 != (XMLCh *)0x0) && (pXVar15 != L"##any")) && (*pXVar15 != L'\0')) {
    lVar16 = 0;
    do {
      psVar14 = (short *)((long)pXVar15 + lVar16);
      if (*psVar14 == 0) {
        if (*(short *)((long)&SchemaSymbols::fgATTVAL_TWOPOUNDANY + lVar16) == 0) goto LAB_00335e40;
        break;
      }
      psVar2 = (short *)((long)&SchemaSymbols::fgATTVAL_TWOPOUNDANY + lVar16);
      lVar16 = lVar16 + 2;
    } while (*psVar14 == *psVar2);
    if (pXVar15 == L"##other") {
LAB_00335e36:
      iVar8 = this->fTargetNSURI;
      type = Any_Other;
    }
    else {
      lVar16 = 0;
      do {
        psVar14 = (short *)((long)pXVar15 + lVar16);
        if (*psVar14 == 0) {
          if (*(short *)((long)&SchemaSymbols::fgATTVAL_TWOPOUNDOTHER + lVar16) == 0)
          goto LAB_00335e36;
          break;
        }
        psVar2 = (short *)((long)&SchemaSymbols::fgATTVAL_TWOPOUNDOTHER + lVar16);
        lVar16 = lVar16 + 2;
      } while (*psVar14 == *psVar2);
      XMLStringTokenizer::XMLStringTokenizer(&local_60,pXVar15,this->fGrammarPoolMemoryManager);
      local_78 = DatatypeValidatorFactory::getDatatypeValidator(this->fDatatypeRegistry,L"anyURI");
LAB_00335cc9:
      bVar7 = XMLStringTokenizer::hasMoreTokens(&local_60);
      if (bVar7) {
        pXVar15 = XMLStringTokenizer::nextToken(&local_60);
        if (pXVar15 == L"##local") {
LAB_00335d44:
          uVar10 = this->fEmptyNamespaceURI;
        }
        else {
          pXVar17 = L"##local";
          if (pXVar15 == (XMLCh *)0x0) {
LAB_00335d11:
            if (*pXVar17 == L'\0') goto LAB_00335d44;
          }
          else {
            pXVar17 = L"##local";
            pXVar18 = pXVar15;
            do {
              XVar3 = *pXVar18;
              if (XVar3 == L'\0') goto LAB_00335d11;
              pXVar18 = pXVar18 + 1;
              XVar4 = *pXVar17;
              pXVar17 = pXVar17 + 1;
            } while (XVar3 == XVar4);
          }
          if (pXVar15 == L"##targetNamespace") {
LAB_00335d84:
            uVar10 = this->fTargetNSURI;
          }
          else {
            pXVar17 = L"##targetNamespace";
            if (pXVar15 == (XMLCh *)0x0) {
LAB_00335d4a:
              if (*pXVar17 == L'\0') goto LAB_00335d84;
            }
            else {
              pXVar17 = L"##targetNamespace";
              pXVar18 = pXVar15;
              do {
                XVar3 = *pXVar18;
                if (XVar3 == L'\0') goto LAB_00335d4a;
                pXVar18 = pXVar18 + 1;
                XVar4 = *pXVar17;
                pXVar17 = pXVar17 + 1;
              } while (XVar3 == XVar4);
            }
            (*(local_78->super_XSerializable)._vptr_XSerializable[8])
                      (local_78,pXVar15,this->fSchemaInfo->fValidationContext,this->fMemoryManager);
            uVar10 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                               (this->fURIStringPool,pXVar15);
          }
        }
        bVar7 = local_a8.fCurCount != 0;
        if (bVar7) goto code_r0x00335d95;
        goto LAB_00335dbe;
      }
      iVar8 = this->fEmptyNamespaceURI;
      XMLStringTokenizer::~XMLStringTokenizer(&local_60);
      type = Any_List;
    }
  }
LAB_00335e40:
  this_00 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
  SchemaAttDef::SchemaAttDef(this_00,L"",L"",iVar8,type,local_7c,this->fGrammarPoolMemoryManager);
  local_b0 = pXVar12;
  if (pXVar12 != (XSAnnotation *)0x0) {
    local_b0 = (XSAnnotation *)0x0;
    SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_00,pXVar12);
  }
  if (local_a8.fCurCount != 0) {
    if (this_00->fNamespaceList == (ValueVectorOf<unsigned_int> *)0x0) {
      this_01 = (ValueVectorOf<unsigned_int> *)
                XMemory::operator_new(0x28,(this_00->super_XMLAttDef).fMemoryManager);
      ValueVectorOf<unsigned_int>::ValueVectorOf(this_01,&local_a8);
      this_00->fNamespaceList = this_01;
    }
    else {
      ValueVectorOf<unsigned_int>::operator=(this_00->fNamespaceList,&local_a8);
    }
  }
  (*(local_a8.fMemoryManager)->_vptr_MemoryManager[4])(local_a8.fMemoryManager,local_a8.fElemList);
  if (local_b0 != (XSAnnotation *)0x0) {
    (*(local_b0->super_XSerializable)._vptr_XSerializable[1])();
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_70);
  return this_00;
code_r0x00335d95:
  if (*local_a8.fElemList != uVar10) {
    uVar6 = 1;
    do {
      uVar19 = uVar6;
      if (local_a8.fCurCount == uVar19) break;
      uVar6 = uVar19 + 1;
    } while (local_a8.fElemList[uVar19] != uVar10);
    bVar7 = uVar19 < local_a8.fCurCount;
LAB_00335dbe:
    if (!bVar7) {
      ValueVectorOf<unsigned_int>::ensureExtraCapacity(&local_a8,1);
      local_a8.fElemList[local_a8.fCurCount] = uVar10;
      local_a8.fCurCount = local_a8.fCurCount + 1;
    }
  }
  goto LAB_00335cc9;
}

Assistant:

SchemaAttDef* TraverseSchema::traverseAnyAttribute(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_AnyAttribute, this, false, fNonXSAttList
    );

    // ------------------------------------------------------------------
    // First, handle any ANNOTATION declaration
    // ------------------------------------------------------------------
    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::AnyAttributeContentError);
    }
    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);
    // ------------------------------------------------------------------
    // Get attributes
    // ------------------------------------------------------------------
    const XMLCh* const processContents = getElementAttValue(elem, SchemaSymbols::fgATT_PROCESSCONTENTS);
    const XMLCh* const nameSpace = getElementAttValue(elem, SchemaSymbols::fgATT_NAMESPACE);

    // ------------------------------------------------------------------
    // Set default att type based on 'processContents' value
    // ------------------------------------------------------------------
    XMLAttDef::DefAttTypes attDefType = XMLAttDef::ProcessContents_Strict;

    if ((!processContents || !*processContents)
        || XMLString::equals(processContents, SchemaSymbols::fgATTVAL_STRICT)) {
        // Do nothing - defaulted already
    }
    else if (XMLString::equals(processContents, SchemaSymbols::fgATTVAL_SKIP)) {
        attDefType = XMLAttDef::ProcessContents_Skip;
    }
    else if (XMLString::equals(processContents, SchemaSymbols::fgATTVAL_LAX)) {
        attDefType = XMLAttDef::ProcessContents_Lax;
    }

    // ------------------------------------------------------------------
    // Process 'namespace' attribute
    // ------------------------------------------------------------------
    int uriIndex = fEmptyNamespaceURI;
    XMLAttDef::AttTypes attType = XMLAttDef::Any_Any;
    ValueVectorOf<unsigned int> namespaceList(8, fGrammarPoolMemoryManager);

    if ((!nameSpace || !*nameSpace)
        || XMLString::equals(nameSpace, SchemaSymbols::fgATTVAL_TWOPOUNDANY)) {
        // Do nothing - defaulted already
    }
    else if (XMLString::equals(nameSpace, SchemaSymbols::fgATTVAL_TWOPOUNDOTHER)) {

        attType = XMLAttDef::Any_Other;
        uriIndex = fTargetNSURI;
    }
    else {

        XMLStringTokenizer tokenizer(nameSpace, fGrammarPoolMemoryManager);
        DatatypeValidator* anyURIDV = fDatatypeRegistry->getDatatypeValidator(SchemaSymbols::fgDT_ANYURI);

        attType = XMLAttDef::Any_List;

        while (tokenizer.hasMoreTokens()) {

            const XMLCh* token = tokenizer.nextToken();

            if (XMLString::equals(token, SchemaSymbols::fgATTVAL_TWOPOUNDLOCAL)) {
                uriIndex = fEmptyNamespaceURI;
            }
            else if (XMLString::equals(token, SchemaSymbols::fgATTVAL_TWOPOUNDTRAGETNAMESPACE)) {
                uriIndex = fTargetNSURI;
            }
            else {

                try {
                    anyURIDV->validate(token
                                     , fSchemaInfo->getValidationContext()
                                     , fMemoryManager);
                }
                catch(const XMLException& excep) {
                    reportSchemaError(elem, excep);
                }
                uriIndex = fURIStringPool->addOrFind(token);
            }

            if (!namespaceList.containsElement(uriIndex)) {
                namespaceList.addElement(uriIndex);
            }
        }

        uriIndex = fEmptyNamespaceURI;
    }

    // ------------------------------------------------------------------
    // Create wildcard attribute
    // ------------------------------------------------------------------
    SchemaAttDef* attDef = new (fGrammarPoolMemoryManager) SchemaAttDef(XMLUni::fgZeroLenString,
                                            XMLUni::fgZeroLenString,
                                            uriIndex, attType, attDefType,
                                            fGrammarPoolMemoryManager);

    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(attDef, janAnnot.release());

    if (namespaceList.size()) {
       attDef->setNamespaceList(&namespaceList);
    }

    return attDef;
}